

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O1

int __thiscall
google::protobuf::compiler::CodeGeneratorResponse_File::ByteSize(CodeGeneratorResponse_File *this)

{
  byte bVar1;
  uint uVar2;
  string *psVar3;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar4;
  int iVar5;
  int iVar6;
  
  bVar1 = (byte)this->_has_bits_[0];
  iVar5 = 0;
  if (bVar1 != 0) {
    if ((bVar1 & 1) != 0) {
      psVar3 = this->name_;
      uVar2 = (uint)psVar3->_M_string_length;
      iVar5 = 2;
      if (0x7f < uVar2) {
        iVar5 = io::CodedOutputStream::VarintSize32Fallback(uVar2);
        iVar5 = iVar5 + 1;
      }
      iVar5 = iVar5 + (int)psVar3->_M_string_length;
    }
    if ((this->_has_bits_[0] & 2) != 0) {
      psVar3 = this->insertion_point_;
      uVar2 = (uint)psVar3->_M_string_length;
      iVar6 = 1;
      if (0x7f < uVar2) {
        iVar6 = io::CodedOutputStream::VarintSize32Fallback(uVar2);
      }
      iVar5 = iVar5 + iVar6 + (int)psVar3->_M_string_length + 1;
    }
    if ((this->_has_bits_[0] & 4) != 0) {
      psVar3 = this->content_;
      uVar2 = (uint)psVar3->_M_string_length;
      iVar6 = 1;
      if (0x7f < uVar2) {
        iVar6 = io::CodedOutputStream::VarintSize32Fallback(uVar2);
      }
      iVar5 = iVar5 + iVar6 + (int)psVar3->_M_string_length + 1;
    }
  }
  pvVar4 = (this->_unknown_fields_).fields_;
  if ((pvVar4 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar4->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar4->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    iVar6 = internal::WireFormat::ComputeUnknownFieldsSize(&this->_unknown_fields_);
    iVar5 = iVar6 + iVar5;
  }
  this->_cached_size_ = iVar5;
  return iVar5;
}

Assistant:

int CodeGeneratorResponse_File::ByteSize() const {
  int total_size = 0;

  if (_has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    // optional string name = 1;
    if (has_name()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->name());
    }

    // optional string insertion_point = 2;
    if (has_insertion_point()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->insertion_point());
    }

    // optional string content = 15;
    if (has_content()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->content());
    }

  }
  if (!unknown_fields().empty()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = total_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}